

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsprg.cpp
# Opt level: O1

CTPNStmTop * __thiscall CTcParser::parse_intrinsic_class(CTcParser *this,int *err)

{
  vm_obj_id_t vVar1;
  bool bVar2;
  bool bVar3;
  tc_toktyp_t tVar4;
  int iVar5;
  CTcToken *pCVar6;
  CTcSymMetaclassBase *this_00;
  CTcSymMetaclassBase *pCVar7;
  CTcSymMetaclass *pCVar8;
  textchar_t *siz;
  textchar_t *unaff_R12;
  size_t unaff_R13;
  int varargs_list;
  int varargs;
  int opt_argc;
  int argc;
  CTcSymLocal *varargs_list_local;
  
  tVar4 = CTcTokenizer::next(G_tok);
  if (tVar4 == TOKT_SYM) {
    pCVar6 = CTcTokenizer::copycur(G_tok);
    unaff_R12 = pCVar6->text_;
    unaff_R13 = pCVar6->text_len_;
    bVar2 = false;
    siz = unaff_R12;
    this_00 = (CTcSymMetaclassBase *)
              CTcPrsSymtab::find(this->global_symtab_,unaff_R12,unaff_R13,(CTcPrsSymtab **)0x0);
    if (this_00 != (CTcSymMetaclassBase *)0x0) {
      if ((*(int *)&(this_00->super_CTcSymbol).super_CTcSymbolBase.super_CVmHashEntryCS.
                    super_CVmHashEntry.field_0x24 == 9) && ((this_00->field_0x58 & 1) != 0)) {
        bVar2 = false;
      }
      else {
        siz = (textchar_t *)0x2b74;
        CTcTokenizer::log_error_curtok(G_tok,0x2b74);
        bVar2 = true;
        this_00 = (CTcSymMetaclassBase *)0x0;
      }
    }
    CTcTokenizer::next(G_tok);
  }
  else {
    siz = (textchar_t *)0x2b73;
    CTcTokenizer::log_error_curtok(G_tok,0x2b73);
    bVar2 = true;
    this_00 = (CTcSymMetaclassBase *)0x0;
  }
  if ((G_tok->curtok_).typ_ == TOKT_SSTR) {
    if (!bVar2) {
      if (this_00 == (CTcSymMetaclassBase *)0x0) {
        this_00 = (CTcSymMetaclassBase *)
                  CTcSymbolBase::operator_new((CTcSymbolBase *)0x60,(size_t)siz);
        vVar1 = G_cg->next_obj_;
        G_cg->next_obj_ = vVar1 + 1;
        CVmHashEntry::CVmHashEntry((CVmHashEntry *)this_00,unaff_R12,unaff_R13,0);
        *(undefined4 *)
         &(this_00->super_CTcSymbol).super_CTcSymbolBase.super_CVmHashEntryCS.super_CVmHashEntry.
          field_0x24 = 9;
        this_00->meta_idx_ = 0;
        this_00->prop_cnt_ = 0;
        this_00->prop_head_ = (CTcSymMetaProp *)0x0;
        this_00->prop_tail_ = (CTcSymMetaProp *)0x0;
        this_00->class_obj_ = vVar1;
        this_00->mod_obj_ = (CTcSymObj *)0x0;
        this_00->super_meta_ = (CTcSymMetaclass *)0x0;
        this_00->field_0x58 = this_00->field_0x58 & 0xfc;
        (this_00->super_CTcSymbol).super_CTcSymbolBase.super_CVmHashEntryCS.super_CVmHashEntry.
        _vptr_CVmHashEntry = (_func_int **)&PTR__CVmHashEntry_003205d8;
        (*this->global_symtab_->_vptr_CTcPrsSymtab[3])(this->global_symtab_,this_00);
      }
      else {
        this_00->field_0x58 = this_00->field_0x58 & 0xfe;
      }
      iVar5 = CTcGenTarg::find_or_add_meta
                        (G_cg,(G_tok->curtok_).text_,(G_tok->curtok_).text_len_,
                         (CTcSymMetaclass *)this_00);
      pCVar7 = &CTcGenTarg::get_meta_sym(G_cg,iVar5)->super_CTcSymMetaclassBase;
      if (pCVar7 != this_00) {
        CTcTokenizer::log_error
                  (0x2b9d,(ulong)(uint)(pCVar7->super_CTcSymbol).super_CTcSymbolBase.
                                       super_CVmHashEntryCS.super_CVmHashEntry.len_,
                   (pCVar7->super_CTcSymbol).super_CTcSymbolBase.super_CVmHashEntryCS.
                   super_CVmHashEntry.str_);
      }
      this_00->meta_idx_ = iVar5;
    }
    CTcTokenizer::next(G_tok);
  }
  else {
    CTcTokenizer::log_error_curtok(G_tok,0x2b6f);
  }
  if ((G_tok->curtok_).typ_ != TOKT_COLON) goto LAB_001dffaa;
  tVar4 = CTcTokenizer::next(G_tok);
  if (tVar4 != TOKT_SYM) {
    CTcTokenizer::log_error_curtok(G_tok,0x2bc1);
    goto LAB_001dffaa;
  }
  pCVar8 = (CTcSymMetaclass *)
           CTcPrsSymtab::find(this->global_symtab_,(G_tok->curtok_).text_,(G_tok->curtok_).text_len_
                              ,(CTcPrsSymtab **)0x0);
  if (pCVar8 == (CTcSymMetaclass *)0x0) {
    iVar5 = 0x2bc2;
LAB_001dff9d:
    CTcTokenizer::log_error_curtok(G_tok,iVar5);
  }
  else {
    if (*(int *)&((CVmHashEntry *)
                 &(pCVar8->super_CTcSymMetaclassBase).super_CTcSymbol.super_CTcSymbolBase)->
                 field_0x24 != 9) {
      iVar5 = 0x2bc7;
      goto LAB_001dff9d;
    }
    if (this_00 != (CTcSymMetaclassBase *)0x0) {
      this_00->super_meta_ = pCVar8;
    }
  }
  CTcTokenizer::next(G_tok);
LAB_001dffaa:
  if ((G_tok->curtok_).typ_ == TOKT_LBRACE) {
    CTcTokenizer::next(G_tok);
  }
  else {
    CTcTokenizer::log_error_curtok(G_tok,0x2b70);
  }
  bVar2 = false;
  do {
    if (bVar2) {
      return (CTPNStmTop *)0x0;
    }
    tVar4 = (G_tok->curtok_).typ_;
    if ((int)tVar4 < 0x18) {
      if (tVar4 != TOKT_EOF) {
        iVar5 = 0;
        if (tVar4 == TOKT_SYM) goto LAB_001e0043;
LAB_001e001d:
        CTcTokenizer::log_error_curtok(G_tok,0x2b72);
LAB_001e00d2:
        CTcTokenizer::next(G_tok);
        goto LAB_001e00fc;
      }
      bVar3 = false;
      CTcTokenizer::log_error(0x2b71);
      *err = 1;
    }
    else if (tVar4 == TOKT_STATIC) {
      tVar4 = CTcTokenizer::next(G_tok);
      iVar5 = 1;
      if (tVar4 == TOKT_SYM) {
LAB_001e0043:
        pCVar6 = CTcTokenizer::copycur(G_tok);
        if (this_00 != (CTcSymMetaclassBase *)0x0) {
          CTcSymMetaclassBase::add_prop(this_00,pCVar6->text_,pCVar6->text_len_,(char *)0x0,iVar5);
        }
        CTcTokenizer::next(G_tok);
        if ((G_tok->curtok_).typ_ == TOKT_LPAR) {
          CTcTokenizer::next(G_tok);
          bVar3 = false;
          parse_formal_list(this,1,1,&argc,&opt_argc,&varargs,&varargs_list,&varargs_list_local,err,
                            0,0,(CTcFormalTypeList **)0x0);
          if (*err != 0) goto LAB_001e00ff;
        }
        iVar5 = parse_req_sem();
        if (iVar5 != 0) {
          *err = 1;
          bVar3 = false;
          goto LAB_001e00ff;
        }
      }
      else {
        CTcTokenizer::log_error(0x2b72);
      }
LAB_001e00fc:
      bVar3 = true;
    }
    else {
      if (tVar4 == TOKT_SEM) goto LAB_001e00d2;
      if (tVar4 != TOKT_RBRACE) goto LAB_001e001d;
      CTcTokenizer::next(G_tok);
      bVar3 = true;
      bVar2 = true;
    }
LAB_001e00ff:
    if (!bVar3) {
      return (CTPNStmTop *)0x0;
    }
  } while( true );
}

Assistant:

CTPNStmTop *CTcParser::parse_intrinsic_class(int *err)
{
    int meta_id;
    int list_done;
    int got_name_tok = FALSE;
    CTcToken meta_tok;
    CTcSymMetaclass *meta_sym = 0;
    
    /* skip the 'class' keyword and check the class name symbol */
    if (G_tok->next() == TOKT_SYM)
    {
        /* get the token */
        meta_tok = *G_tok->copycur();

        /* 
         *   See if it's defined yet.  If it was previously defined as an
         *   external metaclass, 
         */
        meta_sym = (CTcSymMetaclass *)global_symtab_->find(
            meta_tok.get_text(), meta_tok.get_text_len());
        if (meta_sym != 0
            && (meta_sym->get_type() != TC_SYM_METACLASS
                || !meta_sym->is_ext()))
        {
            /* duplicate definition - log an error and forget the symbol */
            G_tok->log_error_curtok(TCERR_REDEF_INTRINS_NAME);
            meta_sym = 0;
        }
        else
        {
            /* note that we successfully parsed the class name token */
            got_name_tok = TRUE;
        }

        /* move on to the next token */
        G_tok->next();
    }
    else
    {
        /* 
         *   note the error, then keep going, assuming the name was
         *   missing but that the rest is well-formed 
         */
        G_tok->log_error_curtok(TCERR_REQ_INTRINS_CLASS_NAME_SYM);
    }

    /* skip the name symbol, and check for the global name string */
    if (G_tok->cur() == TOKT_SSTR)
    {
        /* set up the definitions if we got a valid name token */
        if (got_name_tok)
        {
            /* if we don't already have a symbol table entry, create one */
            if (meta_sym == 0)
            {
                /* no prior symbol table entry - create it and add it */
                meta_sym = new CTcSymMetaclass(
                    meta_tok.get_text(), meta_tok.get_text_len(),
                    FALSE, 0, G_cg->new_obj_id());
                global_symtab_->add_entry(meta_sym);
            }
            else
            {
                /* 
                 *   we have a prior definition, which must have been an
                 *   external import from a symbol file; remove the external
                 *   attribute since we're actually defining it now
                 */
                meta_sym->set_ext(FALSE);
            }

            /* tell the code generator to add this metaclass */
            meta_id = G_cg->find_or_add_meta(
                G_tok->getcur()->get_text(), G_tok->getcur()->get_text_len(),
                meta_sym);

            /* 
             *   if the metaclass was already defined for another symbol,
             *   it's an error
             */
            CTcSymMetaclass *table_sym = G_cg->get_meta_sym(meta_id);
            if (table_sym != meta_sym)
                G_tok->log_error(TCERR_META_ALREADY_DEF,
                                 (int)table_sym->get_sym_len(),
                                 table_sym->get_sym());

            /* set the metaclass ID in the symbol */
            meta_sym->set_meta_idx(meta_id);
        }

        /* skip the name */
        G_tok->next();
    }
    else
    {
        /* 
         *   note the error, then keep going, assuming that the name was
         *   missing but that the rest is correctly formed 
         */
        G_tok->log_error_curtok(TCERR_REQ_INTRINS_CLASS_NAME);
    }

    /* check for the optional intrinsic superclass */
    if (G_tok->cur() == TOKT_COLON)
    {
        /* skip the colon and get the symbol */
        if (G_tok->next() != TOKT_SYM)
        {
            /* note the error, and just continue from here */
            G_tok->log_error_curtok(TCERR_REQ_INTRINS_SUPERCLASS_NAME);
        }
        else
        {
            /* look up the superclass in the global symbols */
            CTcSymMetaclass *sc_meta_sym =
                (CTcSymMetaclass *)global_symtab_->find(
                    G_tok->getcur()->get_text(),
                    G_tok->getcur()->get_text_len());

            /* make sure we found the symbol, and that it's a metaclass */
            if (sc_meta_sym == 0)
            {
                /* the intrinsic superclass is not defined */
                G_tok->log_error_curtok(TCERR_INTRINS_SUPERCLASS_UNDEF);
            }
            else if (sc_meta_sym->get_type() != TC_SYM_METACLASS)
            {
                /* this is not an intrinsic class */
                G_tok->log_error_curtok(TCERR_INTRINS_SUPERCLASS_NOT_INTRINS);
            }
            else
            {
                /* remember the supermetaclass */
                if (meta_sym != 0)
                    meta_sym->set_super_meta(sc_meta_sym);
            }

            /* we're done with the name token */
            G_tok->next();
        }
    }

    /* we need an open brace after that */
    if (G_tok->cur() == TOKT_LBRACE)
    {
        /* skip the brace */
        G_tok->next();
    }
    else
    {
        /* note the error, but keep going */
        G_tok->log_error_curtok(TCERR_REQ_INTRINS_CLASS_LBRACE);
    }

    /* keep going until we find the closing brace */
    for (list_done = FALSE ; !list_done ; )
    {
        CTcToken prop_tok;

        /* presume it won't be a 'static' property */
        int is_static = FALSE;

        /* check what we have */
        switch(G_tok->cur())
        {
        case TOKT_RBRACE:
            /* closing brace - skip it, and we're done */
            G_tok->next();
            list_done = TRUE;
            break;

        case TOKT_EOF:
            /* end of file - log an error */
            G_tok->log_error(TCERR_EOF_IN_INTRINS_CLASS);

            /* return failure */
            *err = TRUE;
            return 0;

        case TOKT_SEM:
            /* empty list element; skip it */
            G_tok->next();
            break;

        case TOKT_STATIC:
            /* note that we have a static property */
            is_static = TRUE;

            /* a symbol must follow */
            if (G_tok->next() != TOKT_SYM)
            {
                G_tok->log_error(TCERR_REQ_INTRINS_CLASS_PROP);
                break;
            }

            /* fall through to parse the rest of the property definition */

        case TOKT_SYM:
            /* remember the property name */
            prop_tok = *G_tok->copycur();

            /* add the property */
            if (meta_sym != 0)
                meta_sym->add_prop(prop_tok.get_text(),
                                   prop_tok.get_text_len(), 0, is_static);

            /* skip the property name symbol */
            G_tok->next();

            /* if there's a formal parameter list, parse it */
            if (G_tok->cur() == TOKT_LPAR)
            {
                int argc;
                int opt_argc;
                int varargs;
                int varargs_list;
                CTcSymLocal *varargs_list_local;

                /* skip the open paren */
                G_tok->next();
                
                /* parse the list, ignoring the symbols defined */
                parse_formal_list(TRUE, TRUE, &argc, &opt_argc, &varargs,
                                  &varargs_list, &varargs_list_local,
                                  err, 0, FALSE, 0);

                /* if a fatal error occurred, return failure */
                if (*err != 0)
                    return 0;
            }

            /* require a semicolon after the property definition */
            if (parse_req_sem())
            {
                *err = TRUE;
                return 0;
            }

            /* done with this function */
            break;

        default:
            /* anything else is an error */
            G_tok->log_error_curtok(TCERR_REQ_INTRINS_CLASS_PROP);

            /* skip the errant token and proceed */
            G_tok->next();
            break;
        }
    }

    /* 
     *   there's no node to return - a metaclass definition doesn't
     *   generate any code, but simply adds entries to the symbol table,
     *   which we've already done 
     */
    return 0;
}